

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.cpp
# Opt level: O1

void __thiscall embree::QuadMesh::setNumTimeSteps(QuadMesh *this,uint numTimeSteps)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  Device *pDVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  undefined4 extraout_var;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  uVar16 = (ulong)numTimeSteps;
  uVar15 = (this->vertices).size_alloced;
  uVar17 = uVar15;
  if ((uVar15 < uVar16) && (uVar17 = uVar16, uVar15 != 0)) {
    while (uVar17 = uVar15, uVar17 < uVar16) {
      uVar15 = uVar17 * 2 + (ulong)(uVar17 * 2 == 0);
    }
  }
  if (uVar16 < (this->vertices).size_active) {
    if (uVar16 < (this->vertices).size_active) {
      lVar18 = uVar16 * 0x38 + 0x30;
      uVar15 = uVar16;
      do {
        plVar3 = *(long **)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs + lVar18)
        ;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x18))();
        }
        uVar15 = uVar15 + 1;
        lVar18 = lVar18 + 0x38;
      } while (uVar15 < (this->vertices).size_active);
    }
    (this->vertices).size_active = uVar16;
  }
  if ((this->vertices).size_alloced == uVar17) {
    uVar15 = (this->vertices).size_active;
    lVar18 = uVar16 - uVar15;
    if (uVar15 <= uVar16 && lVar18 != 0) {
      lVar13 = uVar15 * 0x38 + 0x30;
      do {
        pBVar4 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar13 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar13 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar4 + lVar13 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar4 + lVar13 + -8) = 1;
        *(undefined4 *)((long)pBVar4 + lVar13 + -4) = 0;
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar13) = 0;
        lVar13 = lVar13 + 0x38;
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
    }
    (this->vertices).size_active = uVar16;
  }
  else {
    pDVar5 = (this->vertices).alloc.device;
    pBVar4 = (this->vertices).items;
    iVar12 = (*(pDVar5->super_State).super_RefCount._vptr_RefCount[8])(pDVar5,uVar17 * 0x38,8);
    (this->vertices).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var,iVar12);
    uVar15 = (this->vertices).size_active;
    if (uVar15 != 0) {
      lVar18 = 0x30;
      uVar14 = 0;
      do {
        pBVar6 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar18 + -0x30);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)pBVar4 + lVar18 + -0x20);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)pBVar4 + lVar18 + -0x10);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)pBVar6 + lVar18 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar18 + -0x20);
        *puVar1 = uVar9;
        puVar1[1] = uVar10;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar18 + -0x30);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar18) =
             *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar18);
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar18) = 0;
        uVar14 = uVar14 + 1;
        uVar15 = (this->vertices).size_active;
        lVar18 = lVar18 + 0x38;
      } while (uVar14 < uVar15);
    }
    lVar18 = uVar16 - uVar15;
    if (uVar15 <= uVar16 && lVar18 != 0) {
      lVar13 = uVar15 * 0x38 + 0x30;
      do {
        pBVar6 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar13 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar13 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar6 + lVar13 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar6 + lVar13 + -8) = 1;
        *(undefined4 *)((long)pBVar6 + lVar13 + -4) = 0;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar13) = 0;
        lVar13 = lVar13 + 0x38;
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
    }
    pDVar5 = (this->vertices).alloc.device;
    if (pDVar5 != (Device *)0x0) {
      (*(pDVar5->super_State).super_RefCount._vptr_RefCount[9])(pDVar5,pBVar4);
    }
    (this->vertices).size_active = uVar16;
    (this->vertices).size_alloced = uVar17;
  }
  Geometry::setNumTimeSteps(&this->super_Geometry,numTimeSteps);
  return;
}

Assistant:

void QuadMesh::setNumTimeSteps (unsigned int numTimeSteps)
  {
    vertices.resize(numTimeSteps);
    Geometry::setNumTimeSteps(numTimeSteps);
  }